

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

void Bmc_CexCareBits2_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  while( true ) {
    uVar6 = *(ulong *)pObj;
    if ((~uVar6 & 0x1fffffff1fffffff) == 0) {
      return;
    }
    if ((uVar6 & 0x4000000000000000) != 0) {
      return;
    }
    *(ulong *)pObj = uVar6 | 0x4000000000000000;
    uVar2 = (uint)uVar6;
    if ((~uVar2 & 0x9fffffff) == 0) {
      return;
    }
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) break;
    pObj_00 = pObj + -(ulong)(uVar2 & 0x1fffffff);
    uVar3 = *(uint *)pObj_00 >> 0x1e & 1;
    uVar4 = (uint)(uVar6 >> 0x1d) & 1;
    uVar7 = (uint)(uVar6 >> 0x20);
    uVar6 = (ulong)(uVar7 & 0x1fffffff);
    uVar5 = *(uint *)(pObj + -uVar6) >> 0x1e & 1;
    uVar7 = uVar7 >> 0x1d & 1;
    if ((uVar2 >> 0x1e & 1) == 0) {
      if ((uVar3 != uVar4) && (uVar5 != uVar7)) {
        __assert_fail("fCompl0 == 0 || fCompl1 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                      ,0x21c,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGVar1 = pObj + -uVar6;
      pObj = pObj_00;
      if ((uVar3 != uVar4) && (pObj = pGVar1, uVar5 != uVar7)) {
        return;
      }
    }
    else {
      if ((uVar3 == uVar4) || (uVar5 == uVar7)) {
        __assert_fail("fCompl0 == 1 && fCompl1 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                      ,0x216,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      Bmc_CexCareBits2_rec(p,pObj_00);
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    }
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexTools.c"
                ,0x211,"void Bmc_CexCareBits2_rec(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Bmc_CexCareBits2_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int fCompl0, fCompl1;
    if ( Gia_ObjIsConst0(pObj) )
        return;
    if ( pObj->fMark1 )
        return;
    pObj->fMark1 = 1;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
    if ( pObj->fMark0 )
    {
        assert( fCompl0 == 1 && fCompl1 == 1 );
        Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
        Bmc_CexCareBits2_rec( p, Gia_ObjFanin1(pObj) );
    }
    else
    {
        assert( fCompl0 == 0 || fCompl1 == 0 );
        if ( fCompl0 == 0 )
            Bmc_CexCareBits2_rec( p, Gia_ObjFanin0(pObj) );
        /**/ 
        else 
        /**/ 
        if ( fCompl1 == 0 )
            Bmc_CexCareBits2_rec( p, Gia_ObjFanin1(pObj) );
    }
}